

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void GdlRule::DebugEngineCode
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *vb,uint32_t param_2,
               ostream *strmOut)

{
  value_type vVar1;
  short sVar2;
  int iVar3;
  size_type_conflict sVar4;
  byte *pbVar5;
  reference pvVar6;
  ostream *poVar7;
  ostream *in_RDX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  int n;
  int iTmp;
  int in_stack_000000cc;
  int pstat;
  int gmet;
  short nSignedShort;
  int nSigned;
  uint nUnsigned;
  int slat;
  int cbArgs;
  int op;
  int ib;
  ostream *in_stack_fffffffffffffe78;
  int local_12c;
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  uint local_68;
  uint local_64;
  ushort local_5e;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  string local_40 [32];
  uint local_20;
  int local_1c;
  ostream *local_18;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_8;
  
  local_1c = 0;
  local_18 = in_RDX;
  local_8 = in_RDI;
  do {
    iVar3 = local_1c;
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_8);
    if ((int)sVar4 <= iVar3) {
      return;
    }
    sVar4 = (size_type_conflict)local_1c;
    local_1c = local_1c + 1;
    pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_8,sVar4);
    poVar7 = local_18;
    local_20 = (uint)*pbVar5;
    EngineCodeDebugString_abi_cxx11_(iTmp);
    std::operator<<(poVar7,local_40);
    std::__cxx11::string::~string(local_40);
    local_50 = 0;
    switch(local_20) {
    case 0:
      local_50 = 0;
      break;
    case 1:
      local_50 = 1;
      break;
    case 2:
      sVar4 = (size_type_conflict)local_1c;
      local_1c = local_1c + 1;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_8,sVar4)
      ;
      local_58 = (uint)*pbVar5;
      poVar7 = std::operator<<(local_18," ");
      std::ostream::operator<<(poVar7,local_58);
      break;
    case 3:
      sVar4 = (size_type_conflict)local_1c;
      local_1c = local_1c + 1;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_8,sVar4)
      ;
      local_5e = (ushort)*pbVar5;
      sVar2 = local_5e * 0x100;
      sVar4 = (size_type_conflict)local_1c;
      local_1c = local_1c + 1;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_8,sVar4)
      ;
      local_5e = sVar2 + (ushort)*pbVar5;
      local_5c = (uint)(short)local_5e;
      poVar7 = std::operator<<(local_18," ");
      std::ostream::operator<<(poVar7,local_5c);
      break;
    case 4:
      sVar4 = (size_type_conflict)local_1c;
      local_1c = local_1c + 1;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_8,sVar4)
      ;
      local_58 = (uint)*pbVar5;
      iVar3 = local_58 * 0x100;
      sVar4 = (size_type_conflict)local_1c;
      local_1c = local_1c + 1;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_8,sVar4)
      ;
      local_58 = iVar3 + (uint)*pbVar5;
      poVar7 = std::operator<<(local_18," ");
      std::ostream::operator<<(poVar7,local_58);
      break;
    case 5:
      sVar4 = (size_type_conflict)local_1c;
      local_1c = local_1c + 1;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_8,sVar4)
      ;
      local_58 = (uint)*pbVar5;
      iVar3 = local_58 * 0x100;
      sVar4 = (size_type_conflict)local_1c;
      local_1c = local_1c + 1;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_8,sVar4)
      ;
      local_58 = iVar3 + (uint)*pbVar5;
      iVar3 = local_58 * 0x100;
      sVar4 = (size_type_conflict)local_1c;
      local_1c = local_1c + 1;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_8,sVar4)
      ;
      local_58 = iVar3 + (uint)*pbVar5;
      iVar3 = local_58 * 0x100;
      sVar4 = (size_type_conflict)local_1c;
      local_1c = local_1c + 1;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_8,sVar4)
      ;
      local_5c = iVar3 + (uint)*pbVar5;
      local_58 = local_5c;
      poVar7 = std::operator<<(local_18," ");
      std::ostream::operator<<(poVar7,local_5c);
      break;
    case 6:
      local_50 = 0;
      break;
    case 7:
      local_50 = 0;
      break;
    case 8:
      local_50 = 0;
      break;
    case 9:
      local_50 = 0;
      break;
    case 10:
      local_50 = 0;
      break;
    case 0xb:
      local_50 = 0;
      break;
    case 0xc:
      local_50 = 0;
      break;
    case 0xd:
      local_50 = 0;
      break;
    case 0xe:
      local_50 = 0;
      break;
    case 0xf:
      local_50 = 0;
      break;
    case 0x10:
      local_50 = 0;
      break;
    case 0x11:
      local_50 = 0;
      break;
    case 0x12:
      local_50 = 0;
      break;
    case 0x13:
      local_50 = 0;
      break;
    case 0x14:
      local_50 = 0;
      break;
    case 0x15:
      local_50 = 0;
      break;
    case 0x16:
      local_50 = 0;
      break;
    case 0x17:
      local_50 = 0;
      break;
    case 0x18:
      local_50 = 0;
      break;
    case 0x19:
      local_50 = 0;
      break;
    case 0x1a:
      local_50 = 1;
      break;
    case 0x1b:
      local_50 = 0;
      break;
    case 0x1c:
      sVar4 = (size_type_conflict)local_1c;
      local_1c = local_1c + 1;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_8,sVar4)
      ;
      local_58 = (uint)*pbVar5;
      poVar7 = std::operator<<(local_18," ");
      std::ostream::operator<<(poVar7,local_58);
      local_50 = 0;
      break;
    case 0x1d:
      sVar4 = (size_type_conflict)local_1c;
      local_1c = local_1c + 1;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_8,sVar4)
      ;
      local_5c = (uint)*pbVar5;
      poVar7 = std::operator<<(local_18," ");
      std::ostream::operator<<(poVar7,local_5c);
      sVar4 = (size_type_conflict)local_1c;
      local_1c = local_1c + 1;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_8,sVar4)
      ;
      local_58 = (uint)*pbVar5;
      poVar7 = std::operator<<(local_18," ");
      std::ostream::operator<<(poVar7,local_58);
      sVar4 = (size_type_conflict)local_1c;
      local_1c = local_1c + 1;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_8,sVar4)
      ;
      local_58 = (uint)*pbVar5;
      poVar7 = std::operator<<(local_18," ");
      std::ostream::operator<<(poVar7,local_58);
      local_50 = 0;
      break;
    case 0x1e:
      local_50 = 1;
      break;
    case 0x1f:
      local_50 = 0;
      break;
    case 0x20:
      local_50 = 0;
      break;
    case 0x21:
      sVar4 = (size_type_conflict)local_1c;
      local_1c = local_1c + 1;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_8,sVar4)
      ;
      local_50 = (uint)*pbVar5;
      poVar7 = std::operator<<(local_18," ");
      std::ostream::operator<<(poVar7,local_50);
      break;
    case 0x22:
      local_50 = 2;
      break;
    case 0x23:
    case 0x24:
    case 0x25:
    case 0x26:
      sVar4 = (size_type_conflict)local_1c;
      local_1c = local_1c + 1;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_8,sVar4)
      ;
      local_54 = (uint)*pbVar5;
      in_stack_fffffffffffffe78 = std::operator<<(local_18," ");
      SlotAttributeDebugString_abi_cxx11_(in_stack_000000cc);
      std::operator<<(in_stack_fffffffffffffe78,local_88);
      std::__cxx11::string::~string(local_88);
      local_50 = 0;
      break;
    case 0x27:
    case 0x33:
    case 0x34:
    case 0x35:
      sVar4 = (size_type_conflict)local_1c;
      local_1c = local_1c + 1;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_8,sVar4)
      ;
      local_54 = (uint)*pbVar5;
      poVar7 = std::operator<<(local_18," ");
      SlotAttributeDebugString_abi_cxx11_(in_stack_000000cc);
      std::operator<<(poVar7,local_a8);
      std::__cxx11::string::~string(local_a8);
      local_50 = 1;
      break;
    case 0x28:
      sVar4 = (size_type_conflict)local_1c;
      local_1c = local_1c + 1;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_8,sVar4)
      ;
      local_54 = (uint)*pbVar5;
      poVar7 = std::operator<<(local_18," ");
      SlotAttributeDebugString_abi_cxx11_(in_stack_000000cc);
      std::operator<<(poVar7,local_c8);
      std::__cxx11::string::~string(local_c8);
      local_50 = 1;
      break;
    case 0x29:
    case 0x2c:
      sVar4 = (size_type_conflict)local_1c;
      local_1c = local_1c + 1;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_8,sVar4)
      ;
      local_58 = (uint)*pbVar5;
      poVar7 = std::operator<<(local_18," ");
      std::ostream::operator<<(poVar7,local_58);
      local_50 = 1;
      break;
    case 0x2a:
    case 0x2d:
      sVar4 = (size_type_conflict)local_1c;
      local_1c = local_1c + 1;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_8,sVar4)
      ;
      local_64 = (uint)*pbVar5;
      poVar7 = std::operator<<(local_18," ");
      GlyphMetricDebugString_abi_cxx11_(iVar3);
      std::operator<<(poVar7,local_108);
      std::__cxx11::string::~string(local_108);
      local_50 = 2;
      break;
    case 0x2b:
      local_50 = 2;
      break;
    case 0x2e:
      sVar4 = (size_type_conflict)local_1c;
      local_1c = local_1c + 1;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_8,sVar4)
      ;
      local_54 = (uint)*pbVar5;
      poVar7 = std::operator<<(local_18," ");
      SlotAttributeDebugString_abi_cxx11_(in_stack_000000cc);
      std::operator<<(poVar7,local_e8);
      std::__cxx11::string::~string(local_e8);
      local_50 = 2;
      break;
    default:
      local_50 = 0;
      break;
    case 0x30:
      local_50 = 0;
      break;
    case 0x31:
      local_50 = 0;
      break;
    case 0x32:
      local_50 = 0;
      break;
    case 0x36:
      sVar4 = (size_type_conflict)local_1c;
      local_1c = local_1c + 1;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_8,sVar4)
      ;
      local_68 = (uint)*pbVar5;
      poVar7 = std::operator<<(local_18," ");
      ProcessStateDebugString_abi_cxx11_((int)((ulong)in_stack_fffffffffffffe78 >> 0x20));
      std::operator<<(poVar7,local_128);
      std::__cxx11::string::~string(local_128);
      local_50 = 0;
      break;
    case 0x37:
      local_50 = 0;
      break;
    case 0x3a:
      sVar4 = (size_type_conflict)local_1c;
      local_1c = local_1c + 1;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_8,sVar4)
      ;
      local_5c = (uint)*pbVar5;
      poVar7 = std::operator<<(local_18," ");
      std::ostream::operator<<(poVar7,local_5c);
      sVar4 = (size_type_conflict)local_1c;
      local_1c = local_1c + 1;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_8,sVar4)
      ;
      local_5e = (ushort)*pbVar5;
      sVar2 = local_5e * 0x100;
      sVar4 = (size_type_conflict)local_1c;
      local_1c = local_1c + 1;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_8,sVar4)
      ;
      local_5e = sVar2 + (ushort)*pbVar5;
      local_5c = (uint)(short)local_5e;
      poVar7 = std::operator<<(local_18," ");
      std::ostream::operator<<(poVar7,local_5c);
    case 0x39:
      sVar4 = (size_type_conflict)local_1c;
      local_1c = local_1c + 1;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_8,sVar4)
      ;
      local_5c = (uint)*pbVar5;
      poVar7 = std::operator<<(local_18," ");
      std::ostream::operator<<(poVar7,local_5c);
      sVar4 = (size_type_conflict)local_1c;
      local_1c = local_1c + 1;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_8,sVar4)
      ;
      local_5e = (ushort)*pbVar5;
      sVar2 = local_5e * 0x100;
      sVar4 = (size_type_conflict)local_1c;
      local_1c = local_1c + 1;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_8,sVar4)
      ;
      local_5e = sVar2 + (ushort)*pbVar5;
      local_5c = (uint)(short)local_5e;
      poVar7 = std::operator<<(local_18," ");
      std::ostream::operator<<(poVar7,local_5c);
    case 0x38:
      sVar4 = (size_type_conflict)local_1c;
      local_1c = local_1c + 1;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_8,sVar4)
      ;
      local_5c = (uint)*pbVar5;
      poVar7 = std::operator<<(local_18," ");
      std::ostream::operator<<(poVar7,local_5c);
      sVar4 = (size_type_conflict)local_1c;
      local_1c = local_1c + 1;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_8,sVar4)
      ;
      local_5e = (ushort)*pbVar5;
      sVar2 = local_5e * 0x100;
      sVar4 = (size_type_conflict)local_1c;
      local_1c = local_1c + 1;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_8,sVar4)
      ;
      local_5e = sVar2 + (ushort)*pbVar5;
      local_5c = (uint)(short)local_5e;
      poVar7 = std::operator<<(local_18," ");
      std::ostream::operator<<(poVar7,local_5c);
      sVar4 = (size_type_conflict)local_1c;
      local_1c = local_1c + 1;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_8,sVar4)
      ;
      local_5e = (ushort)*pbVar5;
      sVar2 = local_5e * 0x100;
      sVar4 = (size_type_conflict)local_1c;
      local_1c = local_1c + 1;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_8,sVar4)
      ;
      local_5e = sVar2 + (ushort)*pbVar5;
      local_5c = (uint)(short)local_5e;
      poVar7 = std::operator<<(local_18," ");
      std::ostream::operator<<(poVar7,local_5c);
      break;
    case 0x3b:
      sVar4 = (size_type_conflict)local_1c;
      local_1c = local_1c + 1;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_8,sVar4)
      ;
      local_5e = (ushort)*pbVar5;
      sVar2 = local_5e * 0x100;
      sVar4 = (size_type_conflict)local_1c;
      local_1c = local_1c + 1;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_8,sVar4)
      ;
      local_5e = sVar2 + (ushort)*pbVar5;
      local_5c = (uint)(short)local_5e;
      poVar7 = std::operator<<(local_18," ");
      std::ostream::operator<<(poVar7,local_5c);
      break;
    case 0x3c:
    case 0x3d:
      sVar4 = (size_type_conflict)local_1c;
      local_1c = local_1c + 1;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_8,sVar4)
      ;
      local_5e = (ushort)*pbVar5;
      sVar2 = local_5e * 0x100;
      sVar4 = (size_type_conflict)local_1c;
      local_1c = local_1c + 1;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_8,sVar4)
      ;
      local_5e = sVar2 + (ushort)*pbVar5;
      local_5c = (uint)(short)local_5e;
      poVar7 = std::operator<<(local_18," ");
      std::ostream::operator<<(poVar7,local_5c);
      local_50 = 1;
      break;
    case 0x3e:
      local_50 = 0;
      break;
    case 0x3f:
      local_50 = 0;
      break;
    case 0x40:
      local_50 = 0;
      break;
    case 0x41:
      sVar4 = (size_type_conflict)local_1c;
      local_1c = local_1c + 1;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_8,sVar4)
      ;
      local_58 = (uint)(short)(ushort)*pbVar5;
      iVar3 = local_58 * 0x100;
      sVar4 = (size_type_conflict)local_1c;
      local_1c = local_1c + 1;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_8,sVar4)
      ;
      local_5c = iVar3 + (uint)*pbVar5;
      local_58 = local_5c;
      poVar7 = std::operator<<(local_18," ");
      std::ostream::operator<<(poVar7,local_5c);
      sVar4 = (size_type_conflict)local_1c;
      local_1c = local_1c + 1;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_8,sVar4)
      ;
      local_58 = (uint)(short)(ushort)*pbVar5;
      iVar3 = local_58 * 0x100;
      sVar4 = (size_type_conflict)local_1c;
      local_1c = local_1c + 1;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_8,sVar4)
      ;
      local_5c = iVar3 + (uint)*pbVar5;
      local_58 = local_5c;
      poVar7 = std::operator<<(local_18," ");
      std::ostream::operator<<(poVar7,local_5c);
      local_50 = 0;
      break;
    case 0x42:
      local_50 = 1;
    }
    for (local_12c = 0; local_12c < (int)local_50; local_12c = local_12c + 1) {
      sVar4 = (size_type_conflict)local_1c;
      local_1c = local_1c + 1;
      pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_8,sVar4)
      ;
      vVar1 = *pvVar6;
      poVar7 = std::operator<<(local_18," ");
      std::ostream::operator<<(poVar7,(int)(char)vVar1);
    }
    std::operator<<(local_18,"\n");
  } while( true );
}

Assistant:

void GdlRule::DebugEngineCode(std::vector<gr::byte> & vb, uint32_t /*fxdRuleVersion*/, std::ostream & strmOut)
{
	int ib = 0;
	while (ib < signed(vb.size()))
	{
		int op = vb[ib++];
		strmOut << EngineCodeDebugString(op);

		int cbArgs = 0;
		int slat;
		unsigned int nUnsigned;
		int nSigned;
		signed short int nSignedShort;
		int gmet;
		int pstat;
		switch (op)
		{
		case kopNop:				cbArgs = 0;		break;
		case kopPushByte:			cbArgs = 1;		break;
		case kopPushByteU:
			nUnsigned = (unsigned int)vb[ib++];
			strmOut << " " << nUnsigned;
			break;
		case kopPushShort:
			nSignedShort = (signed short int)vb[ib++];
			nSignedShort = (nSignedShort << 8) + vb[ib++];
			nSigned = (signed int)nSignedShort;
			strmOut << " " << nSigned;
			break;
		case kopPushShortU:
			nUnsigned = (unsigned int)vb[ib++];
			nUnsigned = (nUnsigned << 8) + vb[ib++];
			strmOut << " " << nUnsigned;
			break;
		case kopPushLong:
			nUnsigned = (int)vb[ib++];
			nUnsigned = (nUnsigned << 8) + vb[ib++];
			nUnsigned = (nUnsigned << 8) + vb[ib++];
			nUnsigned = (nUnsigned << 8) + vb[ib++];
			nSigned = (signed int)nUnsigned;
			strmOut << " " << nSigned;
			break;
		case kopAdd:				cbArgs = 0;		break;
		case kopSub:				cbArgs = 0;		break;
		case kopMul:				cbArgs = 0;		break;
		case kopDiv:				cbArgs = 0;		break;
		case kopBitAnd:				cbArgs = 0;		break;
		case kopBitOr:				cbArgs = 0;		break;
		case kopBitNot:				cbArgs = 0;		break;
		case kopMin:				cbArgs = 0;		break;
		case kopMax:				cbArgs = 0;		break;
		case kopNeg:				cbArgs = 0;		break;
		case kopTrunc8:				cbArgs = 0;		break;
		case kopTrunc16:			cbArgs = 0;		break;
		case kopCond:				cbArgs = 0;		break;
		case kopAnd:				cbArgs = 0;		break;
		case kopOr:					cbArgs = 0;		break;
		case kopNot:				cbArgs = 0;		break;
		case kopEqual:				cbArgs = 0;		break;
		case kopNotEq:				cbArgs = 0;		break;
		case kopLess:				cbArgs = 0;		break;
		case kopGtr:				cbArgs = 0;		break;
		case kopLessEq:				cbArgs = 0;		break;
		case kopGtrEq:				cbArgs = 0;		break;
		case kopNext:				cbArgs = 0;		break;
		case kopNextN:				cbArgs = 1;		break;	// N
		case kopCopyNext:			cbArgs = 0;		break;
		case kopPutGlyphV1_2:
			nUnsigned = (unsigned int)vb[ib++];	// output class
			strmOut << " " << nUnsigned;
			cbArgs = 0;
			break;
		case kopPutSubsV1_2:
			nSigned = (signed int)vb[ib++];		// selector
			strmOut << " " << nSigned;
			nUnsigned = (unsigned int)vb[ib++];	// input class
			strmOut << " " << nUnsigned;
			nUnsigned = (unsigned int)vb[ib++];	// output class
			strmOut << " " << nUnsigned;
			cbArgs = 0;
			break;
		case kopPutCopy:			cbArgs = 1;		break;	// selector
		case kopInsert:				cbArgs = 0;		break;
		case kopDelete:				cbArgs = 0;		break;

		case kopPutGlyph:
			nSignedShort = (signed short int)vb[ib++];
			nSignedShort = (nSignedShort << 8) + vb[ib++];
			nSigned = (signed int)nSignedShort;
			strmOut << " " << nSigned;	// output class
			break;

		case kopPutSubs3:
			nSigned = (int)vb[ib++];
			strmOut << " " << nSigned;	// slot offset
			nSignedShort = (signed short int)vb[ib++];
			nSignedShort = (nSignedShort << 8) + vb[ib++];
			nSigned = (signed int)nSignedShort;
			strmOut << " " << nSigned;	// input class
			// fall through
		case kopPutSubs2:
			nSigned = (int)vb[ib++];
			strmOut << " " << nSigned;	// slot offset
			nSignedShort = (signed short int)vb[ib++];
			nSignedShort = (nSignedShort << 8) + vb[ib++];
			nSigned = (signed int)nSignedShort;
			strmOut << " " << nSigned;	// input class
			// fall through
		case kopPutSubs:
			nSigned = (int)vb[ib++];
			strmOut << " " << nSigned;	// slot offset
			nSignedShort = (signed short int)vb[ib++];
			nSignedShort = (nSignedShort << 8) + vb[ib++];
			nSigned = (signed int)nSignedShort;
			strmOut << " " << nSigned;	// input class
			nSignedShort = (signed short int)vb[ib++];
			nSignedShort = (nSignedShort << 8) + vb[ib++];
			nSigned = (signed int)nSignedShort;
			strmOut << " " << nSigned;	// output class
			break;

		case kopAssoc:
			cbArgs = vb[ib++];
			strmOut << " " << cbArgs;
			break;
		case kopCntxtItem:			cbArgs = 2;		break;

		case kopAttrSet:
		case kopAttrAdd:
		case kopAttrSub:
//		case kopAttrBitAnd:
//		case kopAttrBitOr:
		case kopAttrSetSlot:
			slat = vb[ib++];
			strmOut << " " << SlotAttributeDebugString(slat);
			cbArgs = 0;
			break;
		case kopIAttrSet:
		case kopIAttrAdd:
		case kopIAttrSub:
//		case kopIAttrBitAnd:
//		case kopIAttrBitOr:
		case kopIAttrSetSlot:
			slat = vb[ib++];
			strmOut << " " << SlotAttributeDebugString(slat);
			cbArgs = 1;
			break;
		case kopPushSlotAttr:
			slat = vb[ib++];
			strmOut << " " << SlotAttributeDebugString(slat);
			cbArgs = 1;	// selector
			break;
		case kopPushISlotAttr:
			slat = vb[ib++];
			strmOut << " " << SlotAttributeDebugString(slat);
			cbArgs = 2;	// selector, index
			break;
		case kopPushGlyphAttr:
		case kopPushAttToGlyphAttr:
			nSignedShort = (signed short int)vb[ib++];
			nSignedShort = (nSignedShort << 8) + vb[ib++];
			nSigned = (signed int)nSignedShort;
			strmOut << " " << nSigned;	// glyph attribute
			cbArgs = 1;					// selector
			break;
		case kopPushGlyphAttrV1_2:
		case kopPushAttToGAttrV1_2:
			nUnsigned = (unsigned int)vb[ib++]; // glyph attribute
			strmOut << " " << nUnsigned;
			cbArgs = 1;							// selector
			break;
		case kopPushGlyphMetric:
		case kopPushAttToGlyphMetric:
			gmet = vb[ib++];
			strmOut << " " << GlyphMetricDebugString(gmet);
			cbArgs = 2;	// selector, cluster
			break;
		case kopPushFeat:			cbArgs = 2;		break;	// feature internal ID, selector
		//case kopPushIGlyphAttr:	cbArgs = 2;		break;	// glyph attr, index
		case kopPushProcState:
			pstat = vb[ib++];
			strmOut << " " << ProcessStateDebugString(pstat);
			cbArgs = 0;
			break;
		case kopPushVersion:		cbArgs = 0;		break;
		case kopPopRet:				cbArgs = 0;		break;
		case kopRetZero:			cbArgs = 0;		break;
		case kopRetTrue:			cbArgs = 0;		break;
		case kopSetBits:
			nUnsigned = (signed short int)vb[ib++];
			nUnsigned = (nUnsigned << 8) + vb[ib++];
			nSigned = (signed int)nUnsigned;
			strmOut << " " << nSigned;
			nUnsigned = (signed short int)vb[ib++];
			nUnsigned = (nUnsigned << 8) + vb[ib++];
			nSigned = (signed int)nUnsigned;
			strmOut << " " << nSigned;
			cbArgs = 0;
			break;

		case kopFeatSet:			cbArgs = 1;		break;	// feature internal ID

		default:
			Assert(false);
			cbArgs = 0;
		}

		// This loop handles only 8-bit signed values.
		for (int iTmp = 0; iTmp < cbArgs; iTmp++)
		{
			int n = (char)vb[ib++];
			strmOut << " " << n;
		}
		strmOut << "\n";
	}
}